

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

int __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_compare
          (utf8_collator_from_wide *this,char *lb,char *le,char *rb,char *re)

{
  int iVar1;
  collate *pcVar2;
  wchar_t *pwVar3;
  long lVar4;
  long lVar5;
  wchar_t *pwVar6;
  long in_RDI;
  wstring r;
  wstring l;
  undefined8 in_stack_fffffffffffffed0;
  method_type how;
  string *in_stack_fffffffffffffed8;
  wchar_t *pwVar7;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  allocator local_c1;
  string local_c0 [32];
  wstring local_a0 [55];
  allocator local_69;
  string local_68 [32];
  wstring local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"UTF-8",&local_69);
  how = (method_type)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  conv::to_utf<wchar_t>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,how);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"UTF-8",&local_c1);
  conv::to_utf<wchar_t>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,how);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar2 = std::use_facet<std::__cxx11::collate<wchar_t>>((locale *)(in_RDI + 0x18));
  pwVar3 = (wchar_t *)std::__cxx11::wstring::c_str();
  lVar4 = std::__cxx11::wstring::c_str();
  lVar5 = std::__cxx11::wstring::size();
  pwVar7 = (wchar_t *)(lVar4 + lVar5 * 4);
  pwVar6 = (wchar_t *)std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  iVar1 = std::__cxx11::collate<wchar_t>::compare((wchar_t *)pcVar2,pwVar3,pwVar7,pwVar6);
  std::__cxx11::wstring::~wstring(local_a0);
  std::__cxx11::wstring::~wstring(local_48);
  return iVar1;
}

Assistant:

virtual int do_compare(char const *lb,char const *le,char const *rb,char const *re) const
    {
        std::wstring l=conv::to_utf<wchar_t>(lb,le,"UTF-8");
        std::wstring r=conv::to_utf<wchar_t>(rb,re,"UTF-8");
        return std::use_facet<wfacet>(base_).compare(   l.c_str(),l.c_str()+l.size(),
                                                        r.c_str(),r.c_str()+r.size());
    }